

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.h
# Opt level: O0

void __thiscall InstructionVMEvalContext::~InstructionVMEvalContext(InstructionVMEvalContext *this)

{
  InstructionVMEvalContext *this_local;
  
  SmallArray<InstructionVMEvalContext::Storage_*,_32U>::~SmallArray(&this->storageSet);
  Storage::~Storage(&this->heap);
  SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::~SmallArray(&this->stackFrames);
  return;
}

Assistant:

InstructionVMEvalContext(ExpressionContext &ctx, Allocator *allocator): ctx(ctx), stackFrames(allocator), heap(allocator, NULL, "heap"), storageSet(allocator), allocator(allocator)
	{
		errorBuf = 0;
		errorBufSize = 0;
		hasError = false;

		globalFrame = 0;

		emulateKnownExternals = false;
		printExecution = false;

		stackDepthLimit = 64;

		heapSize = 0;

		frameMemoryLimit = 8 * 1024;

		variableMemoryLimit = 4 * 1024;

		instruction = 0;
		instructionsLimit = 64 * 1024;
	}